

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::autoCompleteFileName(QFileDialogPrivate *this,QString *text)

{
  bool bVar1;
  QFlags<QItemSelectionModel::SelectionFlag> QVar2;
  ulong uVar3;
  qsizetype qVar4;
  QItemSelectionModel *pQVar5;
  const_iterator o;
  QModelIndex *pQVar6;
  fd_set *__writefds;
  QWidget *in_RSI;
  long in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  QModelIndex *oldFile;
  add_const_t<QList<QModelIndex>_> *__range3;
  QItemSelectionModel *sm;
  QModelIndex *newFile;
  add_const_t<QList<QModelIndex>_> *__range2_1;
  QString *file;
  QStringList *__range2;
  const_iterator __end3;
  const_iterator __begin3;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QModelIndex idx;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QModelIndex> newFiles;
  QModelIndexList oldFiles;
  QStringList multipleFiles;
  QModelIndex *in_stack_fffffffffffffea8;
  QItemSelectionModel *pQVar8;
  QAbstractItemView *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  QWidget *this_00;
  QFileDialogPrivate *in_stack_fffffffffffffef0;
  const_iterator local_c0;
  undefined1 local_b8 [32];
  const_iterator local_98;
  const_iterator local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QString *local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> local_40;
  QWidget *local_38;
  QWidget *local_30;
  QList<QString> local_28;
  QChar local_a;
  QWidgetItemV2 *local_8;
  
  local_8 = *(QWidgetItemV2 **)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  QVar7 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  __writefds = (fd_set *)0x1;
  uVar3 = QString::startsWith((QLatin1String *)this_00,(CaseSensitivity)QVar7.m_size);
  if ((uVar3 & 1) == 0) {
    QChar::QChar<char16_t,_true>(&local_a,L'\\');
    uVar3 = QString::startsWith((QChar *)in_RSI,(uint)(ushort)local_a.ucs);
    if ((uVar3 & 1) == 0) {
      local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      typedFiles(in_stack_fffffffffffffef0);
      qVar4 = QList<QString>::size(&local_28);
      if (0 < qVar4) {
        local_40._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
             (__uniq_ptr_data<QWExtra,_std::default_delete<QWExtra>,_true,_true>)
             &DAT_aaaaaaaaaaaaaaaa;
        local_38 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
        local_30 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
        QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                  ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                   (in_RDI + 0x370));
        QAbstractItemView::selectionModel(in_stack_fffffffffffffeb0);
        QItemSelectionModel::selectedRows((int)&local_40);
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QModelIndex>::QList((QList<QModelIndex> *)0x75e297);
        local_60.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_60 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffeb0);
        local_68.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffeb0);
        while( true ) {
          local_70 = local_68.i;
          bVar1 = QList<QString>::const_iterator::operator!=(&local_60,local_68);
          if (!bVar1) break;
          QList<QString>::const_iterator::operator*(&local_60);
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          __writefds = (fd_set *)0x0;
          QFileSystemModel::index((QString *)&local_88,(int)*(undefined8 *)(in_RDI + 0x300));
          qVar4 = QList<QModelIndex>::removeAll<QModelIndex>
                            ((QList<QModelIndex> *)in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8);
          if (qVar4 == 0) {
            QList<QModelIndex>::append
                      ((QList<QModelIndex> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          }
          QList<QString>::const_iterator::operator++(&local_60);
        }
        local_90.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_90 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_fffffffffffffeb0);
        local_98.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_fffffffffffffeb0);
        while( true ) {
          local_b8._24_8_ = local_98.i;
          bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_90,local_98);
          if (!bVar1) break;
          pQVar6 = QList<QModelIndex>::const_iterator::operator*(&local_90);
          select((QFileDialogPrivate *)local_b8,(int)in_RDI,(fd_set *)pQVar6,__writefds,in_R8,in_R9)
          ;
          QList<QModelIndex>::const_iterator::operator++(&local_90);
        }
        lineEdit((QFileDialogPrivate *)0x75e4b2);
        bVar1 = QWidget::hasFocus(this_00);
        if (bVar1) {
          QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                    ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                     (in_RDI + 0x370));
          pQVar5 = QAbstractItemView::selectionModel(in_stack_fffffffffffffeb0);
          local_c0.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
          local_c0 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_fffffffffffffeb0);
          o = QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_fffffffffffffeb0);
          while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_c0,o), bVar1) {
            pQVar6 = QList<QModelIndex>::const_iterator::operator*(&local_c0);
            pQVar8 = pQVar5;
            QVar2 = ::operator|((enum_type)((ulong)pQVar6 >> 0x20),(enum_type)pQVar6);
            (**(code **)(*(long *)pQVar8 + 0x68))
                      (pQVar8,pQVar6,
                       QVar2.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                       super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
            QList<QModelIndex>::const_iterator::operator++(&local_c0);
          }
        }
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x75e5e9);
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x75e5f6);
      }
      QList<QString>::~QList((QList<QString> *)0x75e603);
      goto LAB_0075e603;
    }
  }
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
             (in_RDI + 0x370));
  QAbstractItemView::selectionModel(in_stack_fffffffffffffeb0);
  QItemSelectionModel::clearSelection();
LAB_0075e603:
  if (*(QWidgetItemV2 **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::autoCompleteFileName(const QString &text)
{
    if (text.startsWith("//"_L1) || text.startsWith(u'\\')) {
        qFileDialogUi->listView->selectionModel()->clearSelection();
        return;
    }

    const QStringList multipleFiles = typedFiles();
    if (multipleFiles.size() > 0) {
        QModelIndexList oldFiles = qFileDialogUi->listView->selectionModel()->selectedRows();
        QList<QModelIndex> newFiles;
        for (const auto &file : multipleFiles) {
            QModelIndex idx = model->index(file);
            if (oldFiles.removeAll(idx) == 0)
                newFiles.append(idx);
        }
        for (const auto &newFile : std::as_const(newFiles))
            select(newFile);
        if (lineEdit()->hasFocus()) {
            auto *sm = qFileDialogUi->listView->selectionModel();
            for (const auto &oldFile : std::as_const(oldFiles))
                sm->select(oldFile, QItemSelectionModel::Toggle | QItemSelectionModel::Rows);
        }
    }
}